

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O0

ares_bool_t ares_htable_strvp_get(ares_htable_strvp_t *htable,char *key,void **val)

{
  void *pvVar1;
  ares_htable_strvp_bucket_t *bucket;
  void **val_local;
  char *key_local;
  ares_htable_strvp_t *htable_local;
  
  if (val != (void **)0x0) {
    *val = (void *)0x0;
  }
  if ((htable == (ares_htable_strvp_t *)0x0) || (key == (char *)0x0)) {
    htable_local._4_4_ = ARES_FALSE;
  }
  else {
    pvVar1 = ares_htable_get(htable->hash,key);
    if (pvVar1 == (void *)0x0) {
      htable_local._4_4_ = ARES_FALSE;
    }
    else {
      if (val != (void **)0x0) {
        *val = *(void **)((long)pvVar1 + 8);
      }
      htable_local._4_4_ = ARES_TRUE;
    }
  }
  return htable_local._4_4_;
}

Assistant:

ares_bool_t ares_htable_strvp_get(const ares_htable_strvp_t *htable,
                                  const char *key, void **val)
{
  ares_htable_strvp_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL || key == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}